

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::GetJoinerUdpPort
          (Error *__return_storage_ptr__,CommissionerApp *this,uint16_t *aJoinerUdpPort,
          JoinerType aJoinerType)

{
  JoinerType aJoinerType_local;
  uint16_t *aJoinerUdpPort_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetJoinerUdpPort(uint16_t &aJoinerUdpPort, JoinerType aJoinerType) const
{
    UNUSED(aJoinerUdpPort);
    UNUSED(aJoinerType);
    return Error{};
}